

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void Cmd_acsprofile(FCommandLine *argv,APlayerPawn *who,int key)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  size_t __n;
  size_t sVar9;
  code *sorter;
  BYTE *pBVar10;
  bool bVar11;
  TArray<ProfileCollector,_ProfileCollector> FuncProfiles;
  TArray<ProfileCollector,_ProfileCollector> ScriptProfiles;
  char *endptr;
  TArray<ProfileCollector,_ProfileCollector> local_68;
  TArray<ProfileCollector,_ProfileCollector> local_58;
  _func_int_void_ptr_void_ptr *local_48;
  long local_40;
  char *local_38;
  
  local_58.Array = (ProfileCollector *)0x0;
  local_58.Most = 0;
  local_58.Count = 0;
  local_68.Array = (ProfileCollector *)0x0;
  local_68.Most = 0;
  local_68.Count = 0;
  ArrangeScriptProfiles(&local_58);
  ArrangeFunctionProfiles(&local_68);
  iVar3 = FCommandLine::argc(argv);
  if (iVar3 < 2) {
    sorter = sort_by_total_instr;
    lVar7 = 10;
  }
  else {
    pcVar6 = FCommandLine::operator[](argv,1);
    iVar3 = strcasecmp(pcVar6,"clear");
    if (iVar3 == 0) {
      if ((ulong)local_58._8_8_ >> 0x20 != 0) {
        lVar7 = 0;
        do {
          puVar1 = *(undefined8 **)((long)&(local_58.Array)->ProfileData + lVar7);
          *puVar1 = 0;
          puVar1[1] = 0xffffffff00000000;
          *(undefined4 *)(puVar1 + 2) = 0;
          lVar7 = lVar7 + 0x18;
        } while (((ulong)local_58._8_8_ >> 0x20) * 0x18 != lVar7);
      }
      if ((ulong)local_68._8_8_ >> 0x20 != 0) {
        lVar7 = 0;
        do {
          puVar1 = *(undefined8 **)((long)&(local_68.Array)->ProfileData + lVar7);
          *puVar1 = 0;
          puVar1[1] = 0xffffffff00000000;
          *(undefined4 *)(puVar1 + 2) = 0;
          lVar7 = lVar7 + 0x18;
        } while (((ulong)local_68._8_8_ >> 0x20) * 0x18 != lVar7);
      }
      goto LAB_003c2903;
    }
    local_48 = sort_by_total_instr;
    local_40 = 10;
    for (iVar3 = 1; iVar4 = FCommandLine::argc(argv), iVar3 < iVar4; iVar3 = iVar3 + 1) {
      pcVar6 = FCommandLine::operator[](argv,iVar3);
      lVar7 = strtol(pcVar6,&local_38,0);
      pcVar6 = local_38;
      pcVar8 = FCommandLine::operator[](argv,iVar3);
      if (pcVar6 == pcVar8) {
        pcVar6 = FCommandLine::operator[](argv,iVar3);
        __n = strlen(pcVar6);
        pBVar10 = "\x01\x02\x02\x01\x01";
        lVar7 = 0;
        do {
          if (*pBVar10 <= __n) {
            pcVar6 = *(char **)((long)Cmd_acsprofile::sort_names + lVar7);
            sVar9 = strlen(pcVar6);
            if (__n <= sVar9) {
              pcVar8 = FCommandLine::operator[](argv,iVar3);
              iVar5 = strncasecmp(pcVar8,pcVar6,__n);
              if (iVar5 == 0) {
                local_48 = *(_func_int_void_ptr_void_ptr **)
                            ((long)Cmd_acsprofile::sort_funcs + lVar7);
                bVar11 = lVar7 == 0x28;
                goto LAB_003c27e9;
              }
            }
          }
          lVar7 = lVar7 + 8;
          pBVar10 = pBVar10 + 1;
        } while (lVar7 != 0x28);
        bVar11 = true;
LAB_003c27e9:
        bVar2 = false;
        if (bVar11) {
          pcVar6 = FCommandLine::operator[](argv,iVar3);
          Printf("Unknown option \'%s\'\n",pcVar6);
          Printf("acsprofile clear : Reset profiling information\n");
          bVar2 = true;
          Printf("acsprofile [total|min|max|avg|runs] [<limit>]\n");
        }
      }
      else {
        bVar2 = false;
        local_40 = lVar7;
      }
      if (bVar2) break;
    }
    sorter = local_48;
    lVar7 = local_40;
    if (iVar3 < iVar4) goto LAB_003c2903;
  }
  ShowProfileData(&local_58,lVar7,sorter,false);
  ShowProfileData(&local_68,lVar7,sorter,true);
LAB_003c2903:
  TArray<ProfileCollector,_ProfileCollector>::~TArray(&local_68);
  TArray<ProfileCollector,_ProfileCollector>::~TArray(&local_58);
  return;
}

Assistant:

CCMD(acsprofile)
{
	static int (*sort_funcs[])(const void*, const void *) =
	{
		sort_by_total_instr,
		sort_by_min,
		sort_by_max,
		sort_by_avg,
		sort_by_runs
	};
	static const char *sort_names[] = { "total", "min", "max", "avg", "runs" };
	static const BYTE sort_match_len[] = {   1,     2,     2,     1,      1 };

	TArray<ProfileCollector> ScriptProfiles, FuncProfiles;
	long limit = 10;
	int (*sorter)(const void *, const void *) = sort_by_total_instr;

	assert(countof(sort_names) == countof(sort_match_len));

	ArrangeScriptProfiles(ScriptProfiles);
	ArrangeFunctionProfiles(FuncProfiles);

	if (argv.argc() > 1)
	{
		// `acsprofile clear` will zero all profiling information collected so far.
		if (stricmp(argv[1], "clear") == 0)
		{
			ClearProfiles(ScriptProfiles);
			ClearProfiles(FuncProfiles);
			return;
		}
		for (int i = 1; i < argv.argc(); ++i)
		{
			// If it's a number, set the display limit.
			char *endptr;
			long num = strtol(argv[i], &endptr, 0);
			if (endptr != argv[i])
			{
				limit = num;
				continue;
			}
			// If it's a name, set the sort method. We accept partial matches for
			// options that are shorter than the sort name.
			size_t optlen = strlen(argv[i]);
			unsigned int j;
			for (j = 0; j < countof(sort_names); ++j)
			{
				if (optlen < sort_match_len[j] || optlen > strlen(sort_names[j]))
				{ // Too short or long to match.
					continue;
				}
				if (strnicmp(argv[i], sort_names[j], optlen) == 0)
				{
					sorter = sort_funcs[j];
					break;
				}
			}
			if (j == countof(sort_names))
			{
				Printf("Unknown option '%s'\n", argv[i]);
				Printf("acsprofile clear : Reset profiling information\n");
				Printf("acsprofile [total|min|max|avg|runs] [<limit>]\n");
				return;
			}
		}
	}

	ShowProfileData(ScriptProfiles, limit, sorter, false);
	ShowProfileData(FuncProfiles, limit, sorter, true);
}